

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86CMP(uchar *stream,x86Reg reg1,x86Reg reg2)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  x86Reg reg2_local;
  x86Reg reg1_local;
  uchar *stream_local;
  
  uVar2 = encodeRex(stream,false,reg1,reg2);
  puVar3 = stream + uVar2;
  *puVar3 = '9';
  uVar1 = encodeRegister(reg1,regCode[reg2]);
  puVar3[1] = uVar1;
  return ((int)puVar3 + 2) - (int)stream;
}

Assistant:

int x86CMP(unsigned char *stream, x86Reg reg1, x86Reg reg2)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, reg1, reg2);
	*stream++ = 0x39;
	*stream++ = encodeRegister(reg1, regCode[reg2]);

	return int(stream - start);
}